

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

bool __thiscall thread_pool::ThreadPool::TaskQueue::Pop(TaskQueue *this,function<void_()> *f)

{
  bool bVar1;
  reference __x;
  byte local_41;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  function<void_()> *f_local;
  TaskQueue *this_local;
  
  lock._8_8_ = f;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->mutex);
  while( true ) {
    bVar1 = std::
            queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            ::empty(&this->queue);
    local_41 = 0;
    if (bVar1) {
      local_41 = this->is_done ^ 0xff;
    }
    if ((local_41 & 1) == 0) break;
    std::condition_variable::wait((unique_lock *)&this->is_ready);
  }
  bVar1 = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::empty(&this->queue);
  if (!bVar1) {
    __x = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::front(&this->queue);
    std::function<void_()>::operator=((function<void_()> *)lock._8_8_,__x);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::pop(&this->queue);
  }
  this_local._7_1_ = !bVar1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Pop(std::function<void()>* f) {
      std::unique_lock<std::mutex> lock(mutex);
      while (queue.empty() && !is_done) {
        is_ready.wait(lock);
      }
      if (queue.empty()) {
        return false;
      }
      *f = std::move(queue.front());
      queue.pop();
      return true;
    }